

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexPolyhedron.cpp
# Opt level: O1

void __thiscall cbtConvexPolyhedron::initialize2(cbtConvexPolyhedron *this)

{
  float fVar1;
  cbtScalar cVar2;
  int iVar3;
  int iVar4;
  cbtFace *pcVar5;
  int *piVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  bool bVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  ulong uVar17;
  cbtVector3 *pcVar18;
  cbtVector3 *pcVar19;
  uint uVar20;
  cbtVector3 *pcVar21;
  uint uVar22;
  float fVar23;
  undefined1 auVar24 [64];
  float fVar25;
  undefined1 auVar26 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [16];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  
  (this->m_localCenter).m_floats[0] = 0.0;
  (this->m_localCenter).m_floats[1] = 0.0;
  (this->m_localCenter).m_floats[2] = 0.0;
  (this->m_localCenter).m_floats[3] = 0.0;
  uVar20 = (this->m_faces).m_size;
  fVar25 = 0.0;
  if (0 < (int)uVar20) {
    lVar14 = 0;
    fVar25 = 0.0;
    do {
      pcVar5 = (this->m_faces).m_data;
      iVar16 = pcVar5[lVar14].m_indices.m_size;
      if (2 < iVar16) {
        pcVar19 = (this->m_vertices).m_data + *pcVar5[lVar14].m_indices.m_data;
        uVar17 = 1;
        do {
          pcVar18 = (this->m_vertices).m_data;
          piVar6 = (this->m_faces).m_data[lVar14].m_indices.m_data;
          iVar3 = piVar6[uVar17];
          iVar4 = piVar6[uVar17 + 1];
          fVar23 = pcVar19->m_floats[0] - pcVar18[iVar3].m_floats[0];
          fVar7 = pcVar19->m_floats[1] - pcVar18[iVar3].m_floats[1];
          fVar8 = pcVar19->m_floats[2] - pcVar18[iVar3].m_floats[2];
          fVar9 = pcVar19->m_floats[0] - pcVar18[iVar4].m_floats[0];
          fVar10 = pcVar19->m_floats[1] - pcVar18[iVar4].m_floats[1];
          fVar11 = pcVar19->m_floats[2] - pcVar18[iVar4].m_floats[2];
          auVar30 = vfmsub231ss_fma(ZEXT416((uint)(fVar10 * fVar8)),ZEXT416((uint)fVar7),
                                    ZEXT416((uint)fVar11));
          auVar27 = vfmsub231ss_fma(ZEXT416((uint)(fVar11 * fVar23)),ZEXT416((uint)fVar9),
                                    ZEXT416((uint)fVar8));
          auVar12 = vfmsub231ss_fma(ZEXT416((uint)(fVar9 * fVar7)),ZEXT416((uint)fVar23),
                                    ZEXT416((uint)fVar10));
          auVar30 = vfmadd231ss_fma(ZEXT416((uint)(auVar27._0_4_ * auVar27._0_4_)),auVar30,auVar30);
          auVar30 = vfmadd231ss_fma(auVar30,auVar12,auVar12);
          if (auVar30._0_4_ < 0.0) {
            fVar23 = sqrtf(auVar30._0_4_);
          }
          else {
            auVar30 = vsqrtss_avx(auVar30,auVar30);
            fVar23 = auVar30._0_4_;
          }
          uVar17 = uVar17 + 1;
          pcVar21 = pcVar18 + iVar3;
          pcVar18 = pcVar18 + iVar4;
          fVar23 = fVar23 * 0.5;
          fVar7 = pcVar19->m_floats[1];
          fVar8 = pcVar21->m_floats[1];
          fVar9 = pcVar19->m_floats[2];
          fVar10 = pcVar21->m_floats[2];
          fVar11 = pcVar18->m_floats[1];
          fVar1 = pcVar18->m_floats[2];
          (this->m_localCenter).m_floats[0] =
               fVar23 * (pcVar19->m_floats[0] + pcVar21->m_floats[0] + pcVar18->m_floats[0]) *
                        0.33333334 + (this->m_localCenter).m_floats[0];
          (this->m_localCenter).m_floats[1] =
               fVar23 * (fVar7 + fVar8 + fVar11) * 0.33333334 + (this->m_localCenter).m_floats[1];
          (this->m_localCenter).m_floats[2] =
               fVar23 * (fVar9 + fVar10 + fVar1) * 0.33333334 + (this->m_localCenter).m_floats[2];
          fVar25 = fVar25 + fVar23;
        } while (iVar16 - 1 != uVar17);
      }
      lVar14 = lVar14 + 1;
      uVar20 = (this->m_faces).m_size;
    } while (lVar14 < (int)uVar20);
  }
  fVar25 = 1.0 / fVar25;
  fVar23 = fVar25 * (this->m_localCenter).m_floats[0];
  (this->m_localCenter).m_floats[0] = fVar23;
  fVar7 = fVar25 * (this->m_localCenter).m_floats[1];
  (this->m_localCenter).m_floats[1] = fVar7;
  fVar25 = fVar25 * (this->m_localCenter).m_floats[2];
  (this->m_localCenter).m_floats[2] = fVar25;
  this->m_radius = 3.4028235e+38;
  if (0 < (int)uVar20) {
    auVar28 = ZEXT464((uint)this->m_radius);
    pcVar5 = (this->m_faces).m_data;
    lVar14 = 0;
    auVar30._8_4_ = 0x7fffffff;
    auVar30._0_8_ = 0x7fffffff7fffffff;
    auVar30._12_4_ = 0x7fffffff;
    do {
      auVar27 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * *(float *)((long)pcVar5->m_plane + lVar14 + 4
                                                                 ))),ZEXT416((uint)fVar23),
                                ZEXT416(*(uint *)((long)pcVar5->m_plane + lVar14)));
      auVar27 = vfmadd231ss_fma(auVar27,ZEXT416((uint)fVar25),
                                ZEXT416(*(uint *)((long)pcVar5->m_plane + lVar14 + 8)));
      auVar27 = vandps_avx(ZEXT416((uint)(auVar27._0_4_ +
                                         *(float *)((long)pcVar5->m_plane + lVar14 + 0xc))),auVar30)
      ;
      if (auVar27._0_4_ < auVar28._0_4_) {
        this->m_radius = auVar27._0_4_;
        auVar28 = ZEXT1664(auVar27);
      }
      lVar14 = lVar14 + 0x30;
    } while ((ulong)uVar20 * 0x30 != lVar14);
  }
  lVar14 = (long)(this->m_vertices).m_size;
  if (lVar14 < 1) {
    auVar24 = ZEXT464(0x7f7fffff);
    auVar29 = ZEXT464(0xff7fffff);
    auVar32 = ZEXT1664(auVar29._0_16_);
    auVar28 = ZEXT1664(auVar29._0_16_);
    auVar31 = ZEXT1664(auVar24._0_16_);
    auVar26 = ZEXT1664(auVar24._0_16_);
  }
  else {
    pcVar19 = (this->m_vertices).m_data;
    auVar28 = ZEXT464(0xff7fffff);
    auVar26 = ZEXT464(0x7f7fffff);
    lVar15 = 0;
    auVar31 = ZEXT1664(auVar26._0_16_);
    auVar24 = ZEXT1664(auVar26._0_16_);
    auVar32 = ZEXT1664(auVar28._0_16_);
    auVar29 = ZEXT1664(auVar28._0_16_);
    do {
      auVar27 = ZEXT416(*(uint *)((long)pcVar19->m_floats + lVar15));
      auVar30 = vminss_avx(auVar27,auVar26._0_16_);
      auVar26 = ZEXT1664(auVar30);
      auVar30 = vmaxss_avx(auVar27,auVar28._0_16_);
      auVar28 = ZEXT1664(auVar30);
      auVar27 = ZEXT416(*(uint *)((long)pcVar19->m_floats + lVar15 + 4));
      auVar30 = vminss_avx(auVar27,auVar31._0_16_);
      auVar31 = ZEXT1664(auVar30);
      auVar30 = vmaxss_avx(auVar27,auVar32._0_16_);
      auVar32 = ZEXT1664(auVar30);
      auVar27 = ZEXT416(*(uint *)((long)pcVar19->m_floats + lVar15 + 8));
      auVar30 = vminss_avx(auVar27,auVar24._0_16_);
      auVar24 = ZEXT1664(auVar30);
      auVar30 = vmaxss_avx(auVar27,auVar29._0_16_);
      auVar29 = ZEXT1664(auVar30);
      lVar15 = lVar15 + 0x10;
    } while (lVar14 * 0x10 != lVar15);
  }
  (this->mC).m_floats[0] = auVar28._0_4_ + auVar26._0_4_;
  (this->mC).m_floats[1] = auVar32._0_4_ + auVar31._0_4_;
  (this->mC).m_floats[2] = auVar29._0_4_ + auVar24._0_4_;
  (this->mC).m_floats[3] = 0.0;
  fVar23 = auVar28._0_4_ - auVar26._0_4_;
  fVar7 = auVar32._0_4_ - auVar31._0_4_;
  fVar8 = auVar29._0_4_ - auVar24._0_4_;
  (this->mE).m_floats[0] = fVar23;
  (this->mE).m_floats[1] = fVar7;
  (this->mE).m_floats[2] = fVar8;
  (this->mE).m_floats[3] = 0.0;
  fVar25 = this->m_radius;
  auVar27._0_4_ = fVar25 / 1.7320508;
  auVar27._4_12_ = SUB6012((undefined1  [60])0x0,0);
  uVar20 = (uint)(fVar23 < fVar8) * 2;
  if (fVar23 < fVar7) {
    uVar20 = (fVar7 < fVar8) + 1;
  }
  fVar23 = *(float *)((long)(this->mE).m_floats + (ulong)(uVar20 << 2));
  auVar30 = vfmsub213ss_fma(SUB6416(ZEXT464(0x3f000000),0),ZEXT416((uint)fVar23),auVar27);
  (this->m_extents).m_floats[2] = auVar27._0_4_;
  (this->m_extents).m_floats[1] = auVar27._0_4_;
  (this->m_extents).m_floats[0] = auVar27._0_4_;
  *(float *)((long)(this->m_extents).m_floats + (ulong)(uVar20 << 2)) = fVar23 * 0.5;
  iVar16 = 0x400;
  do {
    bVar13 = testContainment(this);
    if (bVar13) {
      fVar25 = (fVar25 - auVar27._0_4_) * 0.0009765625;
      uVar20 = 1 << uVar20 & 3;
      uVar22 = 1 << uVar20 & 3;
      iVar16 = 0x400;
      do {
        fVar23 = (this->m_extents).m_floats[uVar20];
        cVar2 = (this->m_extents).m_floats[uVar22];
        (this->m_extents).m_floats[uVar20] = fVar25 + fVar23;
        (this->m_extents).m_floats[uVar22] = fVar25 + (this->m_extents).m_floats[uVar22];
        bVar13 = testContainment(this);
        if (!bVar13) {
          (this->m_extents).m_floats[uVar20] = fVar23;
          (this->m_extents).m_floats[uVar22] = cVar2;
          return;
        }
        iVar16 = iVar16 + -1;
      } while (iVar16 != 0);
      return;
    }
    (this->m_extents).m_floats[uVar20] =
         (this->m_extents).m_floats[uVar20] - auVar30._0_4_ * 0.0009765625;
    iVar16 = iVar16 + -1;
  } while (iVar16 != 0);
  (this->m_extents).m_floats[2] = auVar27._0_4_;
  (this->m_extents).m_floats[1] = auVar27._0_4_;
  (this->m_extents).m_floats[0] = auVar27._0_4_;
  return;
}

Assistant:

void cbtConvexPolyhedron::initialize2()
{
	m_localCenter.setValue(0, 0, 0);
	cbtScalar TotalArea = 0.0f;
	for (int i = 0; i < m_faces.size(); i++)
	{
		int numVertices = m_faces[i].m_indices.size();
		int NbTris = numVertices - 2;

		const cbtVector3& p0 = m_vertices[m_faces[i].m_indices[0]];
		for (int j = 1; j <= NbTris; j++)
		{
			int k = (j + 1) % numVertices;
			const cbtVector3& p1 = m_vertices[m_faces[i].m_indices[j]];
			const cbtVector3& p2 = m_vertices[m_faces[i].m_indices[k]];
			cbtScalar Area = ((p0 - p1).cross(p0 - p2)).length() * 0.5f;
			cbtVector3 Center = (p0 + p1 + p2) / 3.0f;
			m_localCenter += Area * Center;
			TotalArea += Area;
		}
	}
	m_localCenter /= TotalArea;

#ifdef TEST_INTERNAL_OBJECTS
	if (1)
	{
		m_radius = FLT_MAX;
		for (int i = 0; i < m_faces.size(); i++)
		{
			const cbtVector3 Normal(m_faces[i].m_plane[0], m_faces[i].m_plane[1], m_faces[i].m_plane[2]);
			const cbtScalar dist = cbtFabs(m_localCenter.dot(Normal) + m_faces[i].m_plane[3]);
			if (dist < m_radius)
				m_radius = dist;
		}

		cbtScalar MinX = FLT_MAX;
		cbtScalar MinY = FLT_MAX;
		cbtScalar MinZ = FLT_MAX;
		cbtScalar MaxX = -FLT_MAX;
		cbtScalar MaxY = -FLT_MAX;
		cbtScalar MaxZ = -FLT_MAX;
		for (int i = 0; i < m_vertices.size(); i++)
		{
			const cbtVector3& pt = m_vertices[i];
			if (pt.x() < MinX) MinX = pt.x();
			if (pt.x() > MaxX) MaxX = pt.x();
			if (pt.y() < MinY) MinY = pt.y();
			if (pt.y() > MaxY) MaxY = pt.y();
			if (pt.z() < MinZ) MinZ = pt.z();
			if (pt.z() > MaxZ) MaxZ = pt.z();
		}
		mC.setValue(MaxX + MinX, MaxY + MinY, MaxZ + MinZ);
		mE.setValue(MaxX - MinX, MaxY - MinY, MaxZ - MinZ);

		//		const cbtScalar r = m_radius / sqrtf(2.0f);
		const cbtScalar r = m_radius / sqrtf(3.0f);
		const int LargestExtent = mE.maxAxis();
		const cbtScalar Step = (mE[LargestExtent] * 0.5f - r) / 1024.0f;
		m_extents[0] = m_extents[1] = m_extents[2] = r;
		m_extents[LargestExtent] = mE[LargestExtent] * 0.5f;
		bool FoundBox = false;
		for (int j = 0; j < 1024; j++)
		{
			if (testContainment())
			{
				FoundBox = true;
				break;
			}

			m_extents[LargestExtent] -= Step;
		}
		if (!FoundBox)
		{
			m_extents[0] = m_extents[1] = m_extents[2] = r;
		}
		else
		{
			// Refine the box
			const cbtScalar Step = (m_radius - r) / 1024.0f;
			const int e0 = (1 << LargestExtent) & 3;
			const int e1 = (1 << e0) & 3;

			for (int j = 0; j < 1024; j++)
			{
				const cbtScalar Saved0 = m_extents[e0];
				const cbtScalar Saved1 = m_extents[e1];
				m_extents[e0] += Step;
				m_extents[e1] += Step;

				if (!testContainment())
				{
					m_extents[e0] = Saved0;
					m_extents[e1] = Saved1;
					break;
				}
			}
		}
	}
#endif
}